

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O2

ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> * __thiscall
mp::pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>::operator=
          (ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>> *this,
          ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_> *vm)

{
  std::__cxx11::string::_M_assign((string *)this);
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
            ((ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *)(this + 0x20),&vm->vars_)
  ;
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
            ((ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *)(this + 0x78),&vm->cons_)
  ;
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
            ((ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *)(this + 0xd0),&vm->objs_)
  ;
  *(void **)(this + 0x128) = vm->p_extra_;
  return (ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> *)this
  ;
}

Assistant:

ModelValues& operator=(const ModelValues<VM2>& vm) {
    name_ = vm.GetName();
    vars_ = vm.GetVarValues();
    cons_ = vm.GetConValues();
    objs_ = vm.GetObjValues();
    p_extra_ = vm.ExtraData();
    return *this;
  }